

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

bool __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  block_width_type bVar1;
  unsigned_long *puVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  block_type mask;
  block_width_type extra_bits;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = count_extra_bits((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cbf98
                          );
  if ((bVar1 == 0) ||
     (puVar2 = m_highest_block(in_stack_ffffffffffffffd0),
     (*puVar2 & -1L << ((byte)bVar1 & 0x3f)) == 0)) {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&in_RDI->m_bits);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::capacity(&in_RDI->m_bits);
    if (sVar3 <= sVar4) {
      sVar3 = num_blocks((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cc00a);
      sVar4 = size(in_RDI);
      sVar5 = calc_num_blocks(sVar4);
      if (sVar3 == sVar5) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool dynamic_bitset<Block, Allocator>::m_check_invariants() const
{
    const block_width_type extra_bits = count_extra_bits();
    if (extra_bits > 0) {
        block_type const mask = (~static_cast<Block>(0) << extra_bits);
        if ((m_highest_block() & mask) != 0)
            return false;
    }
    if (m_bits.size() > m_bits.capacity() || num_blocks() != calc_num_blocks(size()))
        return false;

    return true;

}